

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBarBuf.c
# Opt level: O2

int Abc_NtkCheckSingleInstance(Abc_Ntk_t *pNtk)

{
  char *pcVar1;
  Abc_Des_t *pAVar2;
  void *pvVar3;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pObj;
  char *pcVar4;
  int iVar5;
  int iVar6;
  Vec_Ptr_t *p;
  int iVar7;
  
  pAVar2 = pNtk->pDesign;
  if (pAVar2 == (Abc_Des_t *)0x0) {
    iVar5 = 1;
  }
  else {
    iVar5 = 0;
    while( true ) {
      p = pAVar2->vModules;
      iVar7 = p->nSize;
      if (iVar7 <= iVar5) break;
      pvVar3 = Vec_PtrEntry(p,iVar5);
      *(undefined4 *)((long)pvVar3 + 0xc0) = 0;
      iVar5 = iVar5 + 1;
      pAVar2 = pNtk->pDesign;
    }
    iVar5 = 1;
    for (iVar6 = 0; iVar6 < iVar7; iVar6 = iVar6 + 1) {
      pNtk_00 = (Abc_Ntk_t *)Vec_PtrEntry(p,iVar6);
      for (iVar7 = 0; iVar7 < pNtk_00->vBoxes->nSize; iVar7 = iVar7 + 1) {
        pObj = Abc_NtkBox(pNtk_00,iVar7);
        pvVar3 = (pObj->field_5).pData;
        if (pvVar3 != (void *)0x0) {
          if (0 < *(int *)((long)pvVar3 + 0x80)) {
            iVar5 = 0;
            printf("Network \"%s\" contains %d flops.\n",pNtk->pName);
          }
          if (*(int *)((long)pvVar3 + 0xc0) != 0) {
            pcVar1 = pNtk->pName;
            pcVar4 = Abc_ObjName(pObj);
            iVar5 = 0;
            printf("Network \"%s\" contains box \"%s\" whose model \"%s\" is instantiated more than once.\n"
                   ,pcVar1,pcVar4,*(undefined8 *)((long)pvVar3 + 8));
          }
          *(undefined4 *)((long)pvVar3 + 0xc0) = 1;
        }
      }
      p = pNtk->pDesign->vModules;
      iVar7 = p->nSize;
    }
    for (iVar6 = 0; iVar6 < iVar7; iVar6 = iVar6 + 1) {
      pvVar3 = Vec_PtrEntry(p,iVar6);
      *(undefined4 *)((long)pvVar3 + 0xc0) = 0;
      p = pNtk->pDesign->vModules;
      iVar7 = p->nSize;
    }
  }
  return iVar5;
}

Assistant:

int Abc_NtkCheckSingleInstance( Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pTemp, * pModel;
    Abc_Obj_t * pBox;
    int i, k, RetValue = 1;
    if ( pNtk->pDesign == NULL )
        return 1;
    Vec_PtrForEachEntry( Abc_Ntk_t *, pNtk->pDesign->vModules, pTemp, i )
        pTemp->fHieVisited = 0;
    Vec_PtrForEachEntry( Abc_Ntk_t *, pNtk->pDesign->vModules, pTemp, i )
        Abc_NtkForEachBox( pTemp, pBox, k )
        {
            pModel = (Abc_Ntk_t *)pBox->pData;
            if ( pModel == NULL )
                continue;
            if ( Abc_NtkLatchNum(pModel) > 0 )
            {
                printf( "Network \"%s\" contains %d flops.\n",                     
                    Abc_NtkName(pNtk), Abc_NtkLatchNum(pModel) );
                RetValue = 0;
            }
            if ( pModel->fHieVisited )
            {
                printf( "Network \"%s\" contains box \"%s\" whose model \"%s\" is instantiated more than once.\n", 
                    Abc_NtkName(pNtk), Abc_ObjName(pBox), Abc_NtkName(pModel) );
                RetValue = 0;
            }
            pModel->fHieVisited = 1;
        }